

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O1

void __thiscall
icu_63::numparse::impl::AffixMatcherWarehouse::createAffixMatchers
          (AffixMatcherWarehouse *this,AffixPatternProvider *patternInfo,
          MutableMatcherCollection *output,IgnorablesMatcher *ignorables,parse_flags_t parseFlags,
          UErrorCode *status)

{
  NumberParseMatcher **ppNVar1;
  AffixPatternMatcher **ppAVar2;
  NumberParseMatcher *pNVar3;
  AffixPatternMatcher *pAVar4;
  parse_flags_t pVar5;
  MutableMatcherCollection *pMVar6;
  bool bVar7;
  byte bVar8;
  int8_t iVar9;
  int iVar10;
  char16_t *pcVar11;
  AffixPatternMatcher *pAVar12;
  char cVar13;
  AffixPatternMatcher *pAVar14;
  long lVar15;
  AffixPatternMatcher *pAVar16;
  AffixMatcher *rhs;
  AffixPatternMatcher *pAVar17;
  ulong uVar18;
  uint uVar19;
  AffixMatcherWarehouse *pAVar20;
  bool hasSuffix;
  bool hasPrefix;
  AffixMatcher temp;
  UnicodeString sb;
  bool local_13a;
  bool local_139;
  uint local_138;
  uint local_134;
  AffixPatternMatcher *local_130;
  AffixPatternMatcher *local_128;
  ulong local_120;
  AffixMatcherWarehouse *local_118;
  undefined8 local_110;
  undefined1 local_108 [16];
  undefined8 uStack_f8;
  AffixPatternMatcher local_f0;
  parse_flags_t local_a0;
  UNumberSignDisplay local_9c;
  _func_int **local_98;
  AffixPatternMatcher *local_90;
  UErrorCode *local_88;
  AffixPatternProvider *local_80;
  MutableMatcherCollection *local_78;
  UnicodeString local_70;
  
  local_88 = status;
  local_80 = patternInfo;
  bVar7 = isInteresting(patternInfo,ignorables,parseFlags,status);
  if (bVar7) {
    local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003c0258;
    local_70.fUnion.fStackFields.fLengthAndFlags = 2;
    local_9c = (uint)parseFlags >> 10 & UNUM_SIGN_ALWAYS;
    local_90 = this->fAffixPatternMatchers;
    pcVar11 = (char16_t *)CONCAT71((int7)((ulong)local_90 >> 8),2);
    local_98 = (_func_int **)&PTR__ArraySeriesMatcher_003b83e0;
    local_120 = 0;
    local_110 = (AffixMatcher *)((ulong)local_110._4_4_ << 0x20);
    local_130 = (AffixPatternMatcher *)0x0;
    local_128 = (AffixPatternMatcher *)0x0;
    local_118 = this;
    local_a0 = parseFlags;
    local_78 = output;
    do {
      local_134 = (int)pcVar11 - 1;
      local_139 = false;
      iVar9 = (int8_t)local_134;
      local_f0.fPattern.fBuffer.ptr = pcVar11;
      icu_63::number::impl::PatternStringUtils::patternInfoToStringBuilder
                (local_80,true,iVar9,local_9c,OTHER,false,&local_70);
      AffixPatternMatcher::fromAffixPattern
                ((AffixPatternMatcher *)local_108,&local_70,this->fTokenWarehouse,local_a0,
                 &local_139,local_88);
      pAVar14 = local_90 + (int)local_110;
      if (local_90[(int)local_110].super_ArraySeriesMatcher.fMatchers.needToRelease != '\0') {
        uprv_free_63((pAVar14->super_ArraySeriesMatcher).fMatchers.ptr);
      }
      (pAVar14->super_ArraySeriesMatcher).fMatchers.capacity = (int)uStack_f8;
      (pAVar14->super_ArraySeriesMatcher).fMatchers.needToRelease = uStack_f8._4_1_;
      if ((AffixPatternMatcher *)local_108._8_8_ == &local_f0) {
        ppNVar1 = (pAVar14->super_ArraySeriesMatcher).fMatchers.stackArray;
        (pAVar14->super_ArraySeriesMatcher).fMatchers.ptr = ppNVar1;
        memcpy(ppNVar1,&local_f0,(long)(int)uStack_f8 << 3);
      }
      else {
        (pAVar14->super_ArraySeriesMatcher).fMatchers.ptr = (NumberParseMatcher **)local_108._8_8_;
        uStack_f8 = (AffixPatternMatcher *)CONCAT35(uStack_f8._5_3_,3);
        local_108._8_8_ = &local_f0;
      }
      (pAVar14->super_ArraySeriesMatcher).fMatchersLen =
           (int32_t)local_f0.super_ArraySeriesMatcher.fMatchers.stackArray[0];
      if ((pAVar14->fPattern).fBuffer.needToRelease != '\0') {
        uprv_free_63((pAVar14->fPattern).fBuffer.ptr);
      }
      (pAVar14->fPattern).fBuffer.capacity =
           (int)local_f0.super_ArraySeriesMatcher.fMatchers.stackArray[2];
      (pAVar14->fPattern).fBuffer.needToRelease =
           local_f0.super_ArraySeriesMatcher.fMatchers.stackArray[2]._4_1_;
      pNVar3 = (NumberParseMatcher *)
               ((long)local_f0.super_ArraySeriesMatcher.fMatchers.stackArray + 0x16);
      if (local_f0.super_ArraySeriesMatcher.fMatchers.stackArray[1] == pNVar3) {
        pcVar11 = (pAVar14->fPattern).fBuffer.stackArray;
        (pAVar14->fPattern).fBuffer.ptr = pcVar11;
        memcpy(pcVar11,pNVar3,
               (long)(int)local_f0.super_ArraySeriesMatcher.fMatchers.stackArray[2] * 2);
      }
      else {
        (pAVar14->fPattern).fBuffer.ptr =
             (char16_t *)local_f0.super_ArraySeriesMatcher.fMatchers.stackArray[1];
        local_f0.super_ArraySeriesMatcher.fMatchers.stackArray[2]._0_4_ = 4;
        local_f0.super_ArraySeriesMatcher.fMatchers.stackArray[2]._4_1_ = '\0';
        local_f0.super_ArraySeriesMatcher.fMatchers.stackArray[1] = pNVar3;
      }
      local_108._0_8_ = &PTR__AffixPatternMatcher_003b7290;
      MaybeStackArray<char16_t,_4>::~MaybeStackArray
                ((MaybeStackArray<char16_t,_4> *)
                 (local_f0.super_ArraySeriesMatcher.fMatchers.stackArray + 1));
      local_108._0_8_ = local_98;
      MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3>::~MaybeStackArray
                ((MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3> *)
                 (local_108 + 8));
      NumberParseMatcher::~NumberParseMatcher((NumberParseMatcher *)local_108);
      local_f0.fPattern.fBuffer.capacity = (uint)local_139;
      if (local_139 == 0) {
        pAVar14 = (AffixPatternMatcher *)0x0;
      }
      local_13a = false;
      icu_63::number::impl::PatternStringUtils::patternInfoToStringBuilder
                (local_80,false,iVar9,local_9c,OTHER,false,&local_70);
      pVar5 = local_a0;
      AffixPatternMatcher::fromAffixPattern
                ((AffixPatternMatcher *)local_108,&local_70,this->fTokenWarehouse,local_a0,
                 &local_13a,local_88);
      iVar10 = (int)local_110 + local_f0.fPattern.fBuffer.capacity;
      local_110 = (AffixMatcher *)CONCAT44(local_110._4_4_,iVar10);
      pAVar17 = local_90 + iVar10;
      if (local_90[iVar10].super_ArraySeriesMatcher.fMatchers.needToRelease != '\0') {
        uprv_free_63((pAVar17->super_ArraySeriesMatcher).fMatchers.ptr);
      }
      (pAVar17->super_ArraySeriesMatcher).fMatchers.capacity = (int)uStack_f8;
      (pAVar17->super_ArraySeriesMatcher).fMatchers.needToRelease = uStack_f8._4_1_;
      if ((AffixPatternMatcher *)local_108._8_8_ == &local_f0) {
        ppNVar1 = (pAVar17->super_ArraySeriesMatcher).fMatchers.stackArray;
        (pAVar17->super_ArraySeriesMatcher).fMatchers.ptr = ppNVar1;
        memcpy(ppNVar1,&local_f0,(long)(int)uStack_f8 << 3);
      }
      else {
        (pAVar17->super_ArraySeriesMatcher).fMatchers.ptr = (NumberParseMatcher **)local_108._8_8_;
        uStack_f8 = (AffixPatternMatcher *)CONCAT35(uStack_f8._5_3_,3);
        local_108._8_8_ = &local_f0;
      }
      (pAVar17->super_ArraySeriesMatcher).fMatchersLen =
           (int32_t)local_f0.super_ArraySeriesMatcher.fMatchers.stackArray[0];
      if ((pAVar17->fPattern).fBuffer.needToRelease != '\0') {
        uprv_free_63((pAVar17->fPattern).fBuffer.ptr);
      }
      (pAVar17->fPattern).fBuffer.capacity =
           (int)local_f0.super_ArraySeriesMatcher.fMatchers.stackArray[2];
      (pAVar17->fPattern).fBuffer.needToRelease =
           local_f0.super_ArraySeriesMatcher.fMatchers.stackArray[2]._4_1_;
      pNVar3 = (NumberParseMatcher *)
               ((long)local_f0.super_ArraySeriesMatcher.fMatchers.stackArray + 0x16);
      if (local_f0.super_ArraySeriesMatcher.fMatchers.stackArray[1] == pNVar3) {
        pcVar11 = (pAVar17->fPattern).fBuffer.stackArray;
        (pAVar17->fPattern).fBuffer.ptr = pcVar11;
        memcpy(pcVar11,pNVar3,
               (long)(int)local_f0.super_ArraySeriesMatcher.fMatchers.stackArray[2] * 2);
      }
      else {
        (pAVar17->fPattern).fBuffer.ptr =
             (char16_t *)local_f0.super_ArraySeriesMatcher.fMatchers.stackArray[1];
        local_f0.super_ArraySeriesMatcher.fMatchers.stackArray[2]._0_4_ = 4;
        local_f0.super_ArraySeriesMatcher.fMatchers.stackArray[2]._4_1_ = '\0';
        local_f0.super_ArraySeriesMatcher.fMatchers.stackArray[1] = pNVar3;
      }
      local_108._0_8_ = &PTR__AffixPatternMatcher_003b7290;
      MaybeStackArray<char16_t,_4>::~MaybeStackArray
                ((MaybeStackArray<char16_t,_4> *)
                 (local_f0.super_ArraySeriesMatcher.fMatchers.stackArray + 1));
      local_108._0_8_ = local_98;
      MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3>::~MaybeStackArray
                ((MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3> *)
                 (local_108 + 8));
      NumberParseMatcher::~NumberParseMatcher((NumberParseMatcher *)local_108);
      pAVar4 = local_130;
      if (local_13a == false) {
        pAVar17 = (AffixPatternMatcher *)0x0;
      }
      cVar13 = (char)local_f0.fPattern.fBuffer.ptr;
      local_138 = (uint)local_13a;
      pAVar12 = pAVar14;
      pAVar16 = pAVar17;
      if (cVar13 == '\x02') {
LAB_00281d44:
        local_108._0_8_ = &PTR__NumberParseMatcher_003b82c8;
        local_f0.super_ArraySeriesMatcher.super_SeriesMatcher.super_CompositionMatcher.
        super_NumberParseMatcher._vptr_NumberParseMatcher._0_4_ = (uint)(cVar13 == '\0');
        iVar10 = (int)local_120;
        uVar19 = iVar10 + 1;
        local_118->fAffixMatchers[iVar10].fFlags =
             (uint)local_f0.super_ArraySeriesMatcher.super_SeriesMatcher.super_CompositionMatcher.
                   super_NumberParseMatcher._vptr_NumberParseMatcher;
        ppAVar2 = &local_118->fAffixMatchers[iVar10].fPrefix;
        *ppAVar2 = pAVar14;
        ppAVar2[1] = pAVar17;
        local_130 = pAVar12;
        local_128 = pAVar16;
        local_108._8_8_ = pAVar14;
        uStack_f8 = pAVar17;
        local_f0.fPattern.fBuffer._20_4_ =
             (uint)local_f0.super_ArraySeriesMatcher.super_SeriesMatcher.super_CompositionMatcher.
                   super_NumberParseMatcher._vptr_NumberParseMatcher;
        NumberParseMatcher::~NumberParseMatcher((NumberParseMatcher *)local_108);
        this = local_118;
        if ((byte)((char)pVar5 < '\0' & (byte)local_f0.fPattern.fBuffer.capacity & (byte)local_138)
            == 1) {
          if (cVar13 == '\x02') {
LAB_00281ddf:
            local_108._0_8_ = &PTR__NumberParseMatcher_003b82c8;
            uStack_f8 = (AffixPatternMatcher *)0x0;
            local_f0.super_ArraySeriesMatcher.super_SeriesMatcher.super_CompositionMatcher.
            super_NumberParseMatcher._vptr_NumberParseMatcher._0_4_ =
                 local_f0.fPattern.fBuffer._20_4_;
            iVar10 = (int)local_120;
            this->fAffixMatchers[(int)uVar19].fFlags = local_f0.fPattern.fBuffer._20_4_;
            ppAVar2 = &this->fAffixMatchers[(int)uVar19].fPrefix;
            *ppAVar2 = pAVar14;
            ppAVar2[1] = (AffixPatternMatcher *)0x0;
            local_108._8_8_ = pAVar14;
            NumberParseMatcher::~NumberParseMatcher((NumberParseMatcher *)local_108);
            cVar13 = (char)local_f0.fPattern.fBuffer.ptr;
            uVar19 = iVar10 + 2;
          }
          else {
            bVar8 = (byte)local_f0.fPattern.fBuffer.capacity ^ 1;
            if ((local_130 == (AffixPatternMatcher *)0x0 & bVar8) == 0) {
              if (local_130 != (AffixPatternMatcher *)0x0 && bVar8 == 0) {
                bVar7 = CompactUnicodeString<4>::operator==(&pAVar14->fPattern,&local_130->fPattern)
                ;
                cVar13 = (char)local_f0.fPattern.fBuffer.ptr;
                if (bVar7) goto LAB_00281e94;
              }
              goto LAB_00281ddf;
            }
          }
LAB_00281e94:
          if ((cVar13 == '\x02') ||
             ((bVar8 = (byte)local_138 ^ 1, (local_128 == (AffixPatternMatcher *)0x0 & bVar8) == 0
              && ((local_128 == (AffixPatternMatcher *)0x0 || bVar8 != 0 ||
                  (bVar7 = CompactUnicodeString<4>::operator==
                                     (&pAVar17->fPattern,&local_128->fPattern), !bVar7)))))) {
            local_108._0_8_ = &PTR__NumberParseMatcher_003b82c8;
            local_108._8_8_ = (AffixPatternMatcher *)0x0;
            local_f0.super_ArraySeriesMatcher.super_SeriesMatcher.super_CompositionMatcher.
            super_NumberParseMatcher._vptr_NumberParseMatcher._0_4_ =
                 local_f0.fPattern.fBuffer._20_4_;
            this->fAffixMatchers[(int)uVar19].fFlags = local_f0.fPattern.fBuffer._20_4_;
            ppAVar2 = &this->fAffixMatchers[(int)uVar19].fPrefix;
            *ppAVar2 = (AffixPatternMatcher *)0x0;
            ppAVar2[1] = pAVar17;
            uStack_f8 = pAVar17;
            NumberParseMatcher::~NumberParseMatcher((NumberParseMatcher *)local_108);
            uVar19 = uVar19 + 1;
          }
          local_120 = (ulong)uVar19;
          pcVar11 = (char16_t *)(ulong)local_134;
        }
        else {
          local_120 = (ulong)uVar19;
          pcVar11 = (char16_t *)(ulong)local_134;
        }
      }
      else {
        bVar8 = (byte)local_f0.fPattern.fBuffer.capacity ^ 1;
        pAVar12 = pAVar4;
        if ((local_130 == (AffixPatternMatcher *)0x0 & bVar8) == 0) {
          pAVar16 = local_128;
          if (local_130 != (AffixPatternMatcher *)0x0 && bVar8 == 0) {
            bVar7 = CompactUnicodeString<4>::operator==(&pAVar14->fPattern,&local_130->fPattern);
            cVar13 = (char)local_f0.fPattern.fBuffer.ptr;
            pAVar16 = local_128;
            if (bVar7) goto LAB_00281cd4;
          }
          goto LAB_00281d44;
        }
LAB_00281cd4:
        bVar8 = (byte)local_138 ^ 1;
        if ((local_128 == (AffixPatternMatcher *)0x0 & bVar8) == 0) {
          pAVar16 = local_128;
          if (local_128 != (AffixPatternMatcher *)0x0 && bVar8 == 0) {
            bVar7 = CompactUnicodeString<4>::operator==(&pAVar17->fPattern,&local_128->fPattern);
            cVar13 = (char)local_f0.fPattern.fBuffer.ptr;
            pAVar16 = local_128;
            if (bVar7) {
              pcVar11 = (char16_t *)(ulong)local_134;
              this = local_118;
              goto LAB_00281f1d;
            }
          }
          goto LAB_00281d44;
        }
        pcVar11 = (char16_t *)(ulong)local_134;
        local_130 = pAVar4;
        this = local_118;
      }
LAB_00281f1d:
      local_110 = (AffixMatcher *)CONCAT44(local_110._4_4_,(int)local_110 + local_138);
    } while ((byte)pcVar11 < 0x81);
    uVar18 = local_120 & 0xffffffff;
    if (1 < (int)local_120) {
      local_110 = local_118->fAffixMatchers + 1;
      local_f0.fPattern.fBuffer._8_8_ = uVar18 - 1;
      do {
        bVar7 = false;
        lVar15 = local_f0.fPattern.fBuffer._8_8_;
        rhs = local_110;
        do {
          iVar9 = AffixMatcher::compareTo(rhs + -1,rhs);
          if ('\0' < iVar9) {
            local_108._0_8_ = &PTR__NumberParseMatcher_003b82c8;
            local_f0.super_ArraySeriesMatcher.super_SeriesMatcher.super_CompositionMatcher.
            super_NumberParseMatcher._vptr_NumberParseMatcher._0_4_ = rhs[-1].fFlags;
            local_108._8_8_ = rhs[-1].fPrefix;
            uStack_f8 = rhs[-1].fSuffix;
            pAVar14 = rhs->fSuffix;
            rhs[-1].fPrefix = rhs->fPrefix;
            rhs[-1].fSuffix = pAVar14;
            rhs[-1].fFlags = rhs->fFlags;
            rhs->fPrefix = (AffixPatternMatcher *)local_108._8_8_;
            rhs->fSuffix = uStack_f8;
            rhs->fFlags = (uint)local_f0.super_ArraySeriesMatcher.super_SeriesMatcher.
                                super_CompositionMatcher.super_NumberParseMatcher.
                                _vptr_NumberParseMatcher;
            NumberParseMatcher::~NumberParseMatcher((NumberParseMatcher *)local_108);
            bVar7 = true;
          }
          rhs = rhs + 1;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
      } while ((1 < (int)local_120) && (bVar7));
    }
    pMVar6 = local_78;
    pAVar20 = local_118;
    if (0 < (int)local_120) {
      do {
        (*pMVar6->_vptr_MutableMatcherCollection[2])(pMVar6,pAVar20);
        pAVar20 = (AffixMatcherWarehouse *)(pAVar20->fAffixMatchers + 1);
        uVar18 = uVar18 - 1;
      } while (uVar18 != 0);
    }
    UnicodeString::~UnicodeString(&local_70);
  }
  return;
}

Assistant:

void AffixMatcherWarehouse::createAffixMatchers(const AffixPatternProvider& patternInfo,
                                                MutableMatcherCollection& output,
                                                const IgnorablesMatcher& ignorables,
                                                parse_flags_t parseFlags, UErrorCode& status) {
    if (!isInteresting(patternInfo, ignorables, parseFlags, status)) {
        return;
    }

    // The affixes have interesting characters, or we are in strict mode.
    // Use initial capacity of 6, the highest possible number of AffixMatchers.
    UnicodeString sb;
    bool includeUnpaired = 0 != (parseFlags & PARSE_FLAG_INCLUDE_UNPAIRED_AFFIXES);
    UNumberSignDisplay signDisplay = (0 != (parseFlags & PARSE_FLAG_PLUS_SIGN_ALLOWED)) ? UNUM_SIGN_ALWAYS
                                                                                        : UNUM_SIGN_AUTO;

    int32_t numAffixMatchers = 0;
    int32_t numAffixPatternMatchers = 0;

    AffixPatternMatcher* posPrefix = nullptr;
    AffixPatternMatcher* posSuffix = nullptr;

    // Pre-process the affix strings to resolve LDML rules like sign display.
    for (int8_t signum = 1; signum >= -1; signum--) {
        // Generate Prefix
        bool hasPrefix = false;
        PatternStringUtils::patternInfoToStringBuilder(
                patternInfo, true, signum, signDisplay, StandardPlural::OTHER, false, sb);
        fAffixPatternMatchers[numAffixPatternMatchers] = AffixPatternMatcher::fromAffixPattern(
                sb, *fTokenWarehouse, parseFlags, &hasPrefix, status);
        AffixPatternMatcher* prefix = hasPrefix ? &fAffixPatternMatchers[numAffixPatternMatchers++]
                                                : nullptr;

        // Generate Suffix
        bool hasSuffix = false;
        PatternStringUtils::patternInfoToStringBuilder(
                patternInfo, false, signum, signDisplay, StandardPlural::OTHER, false, sb);
        fAffixPatternMatchers[numAffixPatternMatchers] = AffixPatternMatcher::fromAffixPattern(
                sb, *fTokenWarehouse, parseFlags, &hasSuffix, status);
        AffixPatternMatcher* suffix = hasSuffix ? &fAffixPatternMatchers[numAffixPatternMatchers++]
                                                : nullptr;

        if (signum == 1) {
            posPrefix = prefix;
            posSuffix = suffix;
        } else if (equals(prefix, posPrefix) && equals(suffix, posSuffix)) {
            // Skip adding these matchers (we already have equivalents)
            continue;
        }

        // Flags for setting in the ParsedNumber; the token matchers may add more.
        int flags = (signum == -1) ? FLAG_NEGATIVE : 0;

        // Note: it is indeed possible for posPrefix and posSuffix to both be null.
        // We still need to add that matcher for strict mode to work.
        fAffixMatchers[numAffixMatchers++] = {prefix, suffix, flags};
        if (includeUnpaired && prefix != nullptr && suffix != nullptr) {
            // The following if statements are designed to prevent adding two identical matchers.
            if (signum == 1 || !equals(prefix, posPrefix)) {
                fAffixMatchers[numAffixMatchers++] = {prefix, nullptr, flags};
            }
            if (signum == 1 || !equals(suffix, posSuffix)) {
                fAffixMatchers[numAffixMatchers++] = {nullptr, suffix, flags};
            }
        }
    }

    // Put the AffixMatchers in order, and then add them to the output.
    // Since there are at most 9 elements, do a simple-to-implement bubble sort.
    bool madeChanges;
    do {
        madeChanges = false;
        for (int32_t i = 1; i < numAffixMatchers; i++) {
            if (fAffixMatchers[i - 1].compareTo(fAffixMatchers[i]) > 0) {
                madeChanges = true;
                AffixMatcher temp = std::move(fAffixMatchers[i - 1]);
                fAffixMatchers[i - 1] = std::move(fAffixMatchers[i]);
                fAffixMatchers[i] = std::move(temp);
            }
        }
    } while (madeChanges);

    for (int32_t i = 0; i < numAffixMatchers; i++) {
        // Enable the following line to debug affixes
        //std::cout << "Adding affix matcher: " << CStr(fAffixMatchers[i].toString())() << std::endl;
        output.addMatcher(fAffixMatchers[i]);
    }
}